

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void __thiscall cilk_fiber::do_post_switch_actions(cilk_fiber *this)

{
  spin_mutex *psVar1;
  cilk_fiber_pool *in_RDI;
  cilk_fiber *unaff_retaddr;
  cilk_fiber_proc proc;
  cilk_fiber_pool *pool;
  
  pool = in_RDI;
  if (in_RDI[1].lock != (spin_mutex *)0x0) {
    psVar1 = in_RDI[1].lock;
    in_RDI[1].lock = (spin_mutex *)0x0;
    (*(code *)psVar1)();
  }
  if (in_RDI[1].stack_size != 0) {
    remove_reference(unaff_retaddr,pool);
    in_RDI[1].stack_size = 0;
    in_RDI[1].parent = (cilk_fiber_pool *)0x0;
  }
  return;
}

Assistant:

void cilk_fiber::do_post_switch_actions()
{
    if (m_post_switch_proc) 
    {
        cilk_fiber_proc proc = m_post_switch_proc;
        m_post_switch_proc = NULL;
        proc(this);
    }

    if (m_pending_remove_ref)
    {
        m_pending_remove_ref->remove_reference(m_pending_pool);

        // Even if we don't free it, 
        m_pending_remove_ref = NULL;
        m_pending_pool   = NULL;
    }
}